

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeContextCreateEx
          (ze_driver_handle_t hDriver,ze_context_desc_t *desc,uint32_t numDevices,
          ze_device_handle_t *phDevices,ze_context_handle_t *phContext)

{
  ze_context_handle_t p_Var1;
  ze_pfnContextCreateEx_t pfnCreateEx;
  ze_result_t result;
  ze_context_handle_t *phContext_local;
  ze_device_handle_t *phDevices_local;
  uint32_t numDevices_local;
  ze_context_desc_t *desc_local;
  ze_driver_handle_t hDriver_local;
  
  pfnCreateEx._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c310 == (code *)0x0) {
    p_Var1 = (ze_context_handle_t)context_t::get((context_t *)&context);
    *phContext = p_Var1;
  }
  else {
    pfnCreateEx._4_4_ = (*DAT_0011c310)(hDriver,desc,numDevices,phDevices,phContext);
  }
  return pfnCreateEx._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeContextCreateEx(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver object
        const ze_context_desc_t* desc,                  ///< [in] pointer to context descriptor
        uint32_t numDevices,                            ///< [in][optional] number of device handles; must be 0 if `nullptr ==
                                                        ///< phDevices`
        ze_device_handle_t* phDevices,                  ///< [in][optional][range(0, numDevices)] array of device handles which
                                                        ///< context has visibility.
                                                        ///< if nullptr, then all devices and any sub-devices supported by the
                                                        ///< driver instance are
                                                        ///< visible to the context.
                                                        ///< otherwise, the context only has visibility to the devices and any
                                                        ///< sub-devices of the
                                                        ///< devices in this array.
        ze_context_handle_t* phContext                  ///< [out] pointer to handle of context object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreateEx = context.zeDdiTable.Context.pfnCreateEx;
        if( nullptr != pfnCreateEx )
        {
            result = pfnCreateEx( hDriver, desc, numDevices, phDevices, phContext );
        }
        else
        {
            // generic implementation
            *phContext = reinterpret_cast<ze_context_handle_t>( context.get() );

        }

        return result;
    }